

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O0

RatiotestResult ratiotest(Runtime *runtime,QpVector *p,QpVector *rowmove,double alphastart)

{
  long in_RDI;
  QpVector *in_stack_00000028;
  Runtime *in_stack_00000030;
  Instance *in_stack_00000038;
  QpVector *in_stack_00000040;
  QpVector *in_stack_00000048;
  Runtime *in_stack_00000050;
  RatiotestResult local_10;
  
  if ((*(int *)(in_RDI + 0x800) == 0) || (*(int *)(in_RDI + 0x800) != 1)) {
    local_10 = ratiotest_twopass(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                 in_stack_00000038,(double)in_stack_00000030);
  }
  else {
    local_10 = ratiotest_textbook(in_stack_00000030,in_stack_00000028,(QpVector *)runtime,
                                  (Instance *)p,(double)rowmove);
  }
  return local_10;
}

Assistant:

RatiotestResult ratiotest(Runtime& runtime, const QpVector& p,
                          const QpVector& rowmove, double alphastart) {
  switch (runtime.settings.ratiotest) {
    case RatiotestStrategy::Textbook:
      return ratiotest_textbook(runtime, p, rowmove, runtime.instance,
                                alphastart);
    case RatiotestStrategy::TwoPass:
    default:  // to fix -Wreturn-type warning
      return ratiotest_twopass(runtime, p, rowmove,
                               runtime.relaxed_for_ratiotest, alphastart);
  }
}